

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

void __thiscall
glslang::TReflectionTraverser::TReflectionTraverser
          (TReflectionTraverser *this,TIntermediate *i,TReflection *r)

{
  _Rb_tree_header *p_Var1;
  
  TIntermTraverser::TIntermTraverser(&this->super_TIntermTraverser,true,false,false,false);
  (this->super_TIntermTraverser)._vptr_TIntermTraverser =
       (_func_int **)&PTR__TReflectionTraverser_00a5bfa0;
  this->intermediate = i;
  this->reflection = r;
  (this->processedDerefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->processedDerefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->processedDerefs)._M_t._M_impl.super__Rb_tree_header;
  (this->processedDerefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->processedDerefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->processedDerefs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->updateStageMasks = true;
  return;
}

Assistant:

TReflectionTraverser(const TIntermediate& i, TReflection& r) :
	                     TIntermTraverser(), intermediate(i), reflection(r), updateStageMasks(true) { }